

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3ExprGlobalHitsCb(Fts3Expr *pExpr,int iPhrase,void *pCtx)

{
  u8 uVar1;
  undefined4 uVar2;
  Fts3Cursor *pCsr;
  sqlite3_vtab *psVar3;
  sqlite3_int64 sVar4;
  int iVar5;
  int iVar6;
  Fts3Expr *pExpr_00;
  u32 *puVar7;
  undefined4 *puVar8;
  Fts3Expr *pFVar9;
  long lVar10;
  long lVar11;
  Fts3Expr *pFVar12;
  bool bVar13;
  int local_60;
  u8 local_59;
  sqlite3_int64 local_58;
  sqlite3_int64 local_50;
  long local_48;
  Fts3Expr *local_40;
  long local_38;
  
  pCsr = *pCtx;
  local_38 = *(long *)((long)pCtx + 0x20);
  local_48 = (long)(iPhrase * *(int *)((long)pCtx + 8) * 3);
  psVar3 = (pCsr->base).pVtab;
  if ((pExpr->bDeferred == '\0') || (pExpr->pParent->eType == 1)) {
    local_60 = 0;
    if (pExpr->aMI == (u32 *)0x0) {
      local_58 = pCsr->iPrevId;
      pFVar12 = pExpr;
      do {
        pExpr_00 = pFVar12;
        pFVar12 = pExpr_00->pParent;
        if (pFVar12 == (Fts3Expr *)0x0) break;
      } while (pFVar12->eType == 1);
      local_50 = pExpr_00->iDocid;
      local_59 = pExpr_00->bEof;
      pFVar12 = pExpr_00;
      local_40 = pExpr;
      do {
        pFVar9 = pFVar12;
        if (pFVar12->eType != 5) {
          pFVar9 = pFVar12->pRight;
        }
        iVar6 = *(int *)&psVar3[2].pModule;
        iVar5 = sqlite3_initialize();
        if (iVar5 != 0) {
          pFVar9->aMI = (u32 *)0x0;
          return 7;
        }
        puVar7 = (u32 *)sqlite3Malloc((long)iVar6 * 0xc);
        pFVar9->aMI = puVar7;
        if (puVar7 == (u32 *)0x0) {
          return 7;
        }
        memset(puVar7,0,(long)*(int *)&psVar3[2].pModule * 0xc);
        pFVar12 = pFVar12->pLeft;
      } while (pFVar12 != (Fts3Expr *)0x0);
      fts3EvalRestart(pCsr,pExpr_00,&local_60);
      sVar4 = local_50;
      if (local_60 == 0 && pCsr->isEof == '\0') {
LAB_001c8660:
        do {
          if (pCsr->isRequireSeek == '\0') {
            sqlite3_reset(pCsr->pStmt);
          }
          fts3EvalNextRow(pCsr,pExpr_00,&local_60);
          uVar1 = pExpr_00->bEof;
          pCsr->isEof = uVar1;
          pCsr->isRequireSeek = '\x01';
          pCsr->isMatchinfoNeeded = 1;
          pCsr->iPrevId = pExpr_00->iDocid;
          if (uVar1 != '\0') break;
          if (pExpr_00->eType == 1) {
            iVar6 = sqlite3Fts3EvalTestDeferred(pCsr,&local_60);
            if (iVar6 != 0) goto LAB_001c8660;
            bVar13 = pCsr->isEof != '\0';
          }
          else {
            bVar13 = false;
          }
          if ((((local_60 != 0) || (bVar13)) ||
              (fts3EvalUpdateCounts(pExpr_00,*(int *)&psVar3[2].pModule), pCsr->isEof != '\0')) ||
             (local_60 != 0)) break;
        } while( true );
      }
      pCsr->isEof = '\0';
      pCsr->iPrevId = local_58;
      if (local_59 == '\0') {
        fts3EvalRestart(pCsr,pExpr_00,&local_60);
        do {
          fts3EvalNextRow(pCsr,pExpr_00,&local_60);
          if (pExpr_00->iDocid == sVar4) break;
        } while (local_60 == 0);
      }
      else {
        pExpr_00->bEof = local_59;
      }
      pExpr = local_40;
      if (local_60 != 0) {
        return local_60;
      }
    }
    if (0 < *(int *)&psVar3[2].pModule) {
      local_38 = local_38 + local_48 * 4;
      puVar7 = pExpr->aMI;
      lVar10 = 8;
      lVar11 = 0;
      do {
        *(undefined4 *)(local_38 + -4 + lVar10) = *(undefined4 *)((long)puVar7 + lVar10 + -4);
        *(undefined4 *)(local_38 + lVar10) = *(undefined4 *)((long)puVar7 + lVar10);
        lVar11 = lVar11 + 1;
        lVar10 = lVar10 + 0xc;
      } while (lVar11 < *(int *)&psVar3[2].pModule);
      return 0;
    }
  }
  else if (0 < *(int *)&psVar3[2].pModule) {
    uVar2 = (undefined4)pCsr->nDoc;
    puVar8 = (undefined4 *)(local_38 + local_48 * 4 + 8);
    lVar10 = 0;
    do {
      puVar8[-1] = uVar2;
      *puVar8 = uVar2;
      lVar10 = lVar10 + 1;
      puVar8 = puVar8 + 3;
    } while (lVar10 < *(int *)&psVar3[2].pModule);
    return 0;
  }
  return 0;
}

Assistant:

static int fts3ExprGlobalHitsCb(
  Fts3Expr *pExpr,                /* Phrase expression node */
  int iPhrase,                    /* Phrase number (numbered from zero) */
  void *pCtx                      /* Pointer to MatchInfo structure */
){
  MatchInfo *p = (MatchInfo *)pCtx;
  return sqlite3Fts3EvalPhraseStats(
      p->pCursor, pExpr, &p->aMatchinfo[3*iPhrase*p->nCol]
  );
}